

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetCurrentNetworkXpan(Registry *this,uint64_t *aRet)

{
  Status SVar1;
  undefined1 local_80 [8];
  Network nwk;
  Status status;
  uint64_t *aRet_local;
  Registry *this_local;
  
  Network::Network((Network *)local_80);
  SVar1 = GetCurrentNetwork(this,(Network *)local_80);
  if (SVar1 == kSuccess) {
    *aRet = nwk.mName.field_2._8_8_;
  }
  nwk._95_1_ = SVar1;
  Network::~Network((Network *)local_80);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetCurrentNetworkXpan(uint64_t &aRet)
{
    Registry::Status status;
    Network          nwk;
    VerifyOrExit(Registry::Status::kSuccess == (status = GetCurrentNetwork(nwk)));
    aRet = nwk.mXpan;
exit:
    return status;
}